

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleZomby.cpp
# Opt level: O1

shared_ptr<SimpleZomby::Zomby> SimpleZomby::Zomby::create(void)

{
  Zomby *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<SimpleZomby::Zomby> sVar1;
  
  __p = (Zomby *)operator_new(0x38);
  (__p->super_enable_shared_from_this<SimpleZomby::Zomby>)._M_weak_this.
  super___weak_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__p->super_enable_shared_from_this<SimpleZomby::Zomby>)._M_weak_this.
  super___weak_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->super_Manager)._vptr_Manager = (_func_int **)&PTR__Zomby_00106b30;
  (__p->_thread)._M_id._M_thread = 0;
  (__p->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->_semaphore)._M_base._M_i = false;
  (in_RDI->super_Manager)._vptr_Manager = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<SimpleZomby::Zomby*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &in_RDI->super_enable_shared_from_this<SimpleZomby::Zomby>,__p);
  std::__shared_ptr<SimpleZomby::Zomby,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<SimpleZomby::Zomby,SimpleZomby::Zomby>
            ((__shared_ptr<SimpleZomby::Zomby,(__gnu_cxx::_Lock_policy)2> *)in_RDI,__p);
  sVar1.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<SimpleZomby::Zomby>)
         sVar1.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Zomby> Zomby::create()
{
    return std::shared_ptr<Zomby>(new Zomby());
}